

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O3

bool anon_unknown.dwarf_1f52d9::matched(AffixPatternMatcher *affix,UnicodeString *patternString)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  bool bVar4;
  UnicodeString UStack_58;
  
  if (affix == (AffixPatternMatcher *)0x0) {
    bVar4 = (bool)(*(byte *)&patternString->fUnion & 1);
  }
  else {
    icu_63::numparse::impl::AffixPatternMatcher::getPattern(&UStack_58,affix);
    if ((UStack_58.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      if (-1 < UStack_58.fUnion.fStackFields.fLengthAndFlags) {
        UStack_58.fUnion.fFields.fLength = (int)UStack_58.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      sVar1 = (patternString->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar3 = (patternString->fUnion).fFields.fLength;
      }
      else {
        iVar3 = (int)sVar1 >> 5;
      }
      bVar4 = false;
      if ((((int)sVar1 & 1U) == 0) && (bVar4 = false, UStack_58.fUnion.fFields.fLength == iVar3)) {
        UVar2 = icu_63::UnicodeString::doEquals
                          (&UStack_58,patternString,UStack_58.fUnion.fFields.fLength);
        bVar4 = UVar2 != '\0';
      }
    }
    else {
      bVar4 = (bool)(*(byte *)&patternString->fUnion & 1);
    }
    icu_63::UnicodeString::~UnicodeString(&UStack_58);
  }
  return bVar4;
}

Assistant:

static bool matched(const AffixPatternMatcher* affix, const UnicodeString& patternString) {
    return (affix == nullptr && patternString.isBogus()) ||
           (affix != nullptr && affix->getPattern() == patternString);
}